

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void __thiscall
libtorrent::dht::node::get_item
          (node *this,public_key *pk,string *salt,
          function<void_(const_libtorrent::dht::item_&,_bool)> *f)

{
  dht_observer *pdVar1;
  int iVar2;
  function<void_(const_libtorrent::dht::item_&,_bool)> *out;
  span<const_char> in;
  shared_ptr<libtorrent::dht::get_item> ta;
  char hex_key [65];
  
  pdVar1 = this->m_observer;
  if (pdVar1 != (dht_observer *)0x0) {
    out = f;
    iVar2 = (**(pdVar1->super_dht_logger)._vptr_dht_logger)(pdVar1,1);
    if ((char)iVar2 != '\0') {
      in.m_len = (difference_type)hex_key;
      in.m_ptr = (char *)0x20;
      aux::to_hex((aux *)pk,in,(char *)out);
      (*(this->m_observer->super_dht_logger)._vptr_dht_logger[1])
                (this->m_observer,1,"starting get for [ key: %s ]",hex_key);
    }
  }
  hex_key[0x10] = '\0';
  hex_key[0x11] = '\0';
  hex_key[0x12] = '\0';
  hex_key[0x13] = '\0';
  hex_key[0x14] = '\0';
  hex_key[0x15] = '\0';
  hex_key[0x16] = '\0';
  hex_key[0x17] = '\0';
  hex_key[0x18] = '\0';
  hex_key[0x19] = '\0';
  hex_key[0x1a] = '\0';
  hex_key[0x1b] = '\0';
  hex_key[0x1c] = '\0';
  hex_key[0x1d] = '\0';
  hex_key[0x1e] = '\0';
  hex_key[0x1f] = '\0';
  hex_key[0] = '\0';
  hex_key[1] = '\0';
  hex_key[2] = '\0';
  hex_key[3] = '\0';
  hex_key[4] = '\0';
  hex_key[5] = '\0';
  hex_key[6] = '\0';
  hex_key[7] = '\0';
  hex_key[8] = '\0';
  hex_key[9] = '\0';
  hex_key[10] = '\0';
  hex_key[0xb] = '\0';
  hex_key[0xc] = '\0';
  hex_key[0xd] = '\0';
  hex_key[0xe] = '\0';
  hex_key[0xf] = '\0';
  ::std::
  make_shared<libtorrent::dht::get_item,libtorrent::dht::node&,libtorrent::dht::public_key_const&,std::__cxx11::string_const&,std::function<void(libtorrent::dht::item_const&,bool)>,std::function<void(std::vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>const&)>>
            ((node *)&ta,(public_key *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pk,
             (function<void_(const_libtorrent::dht::item_&,_bool)> *)salt,
             (function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
              *)f);
  ::std::_Function_base::~_Function_base((_Function_base *)hex_key);
  (*((ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_find_data).super_traversal_algorithm._vptr_traversal_algorithm[3])();
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void node::get_item(public_key const& pk, std::string const& salt
	, std::function<void(item const&, bool)> f)
{
#ifndef TORRENT_DISABLE_LOGGING
	if (m_observer != nullptr && m_observer->should_log(dht_logger::node))
	{
		char hex_key[65];
		aux::to_hex(pk.bytes, hex_key);
		m_observer->log(dht_logger::node, "starting get for [ key: %s ]", hex_key);
	}
#endif

	auto ta = std::make_shared<dht::get_item>(*this, pk, salt, std::move(f)
		, find_data::nodes_callback());
	ta->start();
}